

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::LegacyScriptPubKeyMan::GetNewDestination(LegacyScriptPubKeyMan *this,OutputType type)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  int in_EDX;
  long *in_RSI;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock0;
  CPubKey new_key;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffe58;
  T *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 uVar5;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pszFile;
  undefined4 in_stack_fffffffffffffe90;
  OutputType in_stack_fffffffffffffe94;
  CPubKey *in_stack_fffffffffffffe98;
  CPubKey *in_stack_fffffffffffffea0;
  ConstevalStringLiteral in_stack_fffffffffffffea8;
  OutputType in_stack_fffffffffffffed4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  sVar3 = std::
          unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
          ::count((unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
                   *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                  (key_type *)in_stack_fffffffffffffe60);
  if (sVar3 == 0) {
    ::_(in_stack_fffffffffffffea8);
    util::
    Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
    ::Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (Error *)in_stack_fffffffffffffe60);
    util::Error::~Error((Error *)in_stack_fffffffffffffe58);
  }
  else {
    if (in_EDX == 3) {
      __assert_fail("type != OutputType::BECH32M",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x24,
                    "virtual util::Result<CTxDestination> wallet::LegacyScriptPubKeyMan::GetNewDestination(const OutputType)"
                   );
    }
    uVar5 = 0;
    (**(code **)(*in_RSI + 0x48))();
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe58);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98,
               (AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),(char *)in_RSI,
               (char *)pszFile,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe58);
    bVar2 = GetKeyFromPool((LegacyScriptPubKeyMan *)in_stack_fffffffffffffea8.lit,
                           in_stack_fffffffffffffea0,in_stack_fffffffffffffed4);
    uVar4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe68);
    if (bVar2) {
      LearnRelatedScripts((LegacyScriptPubKeyMan *)in_stack_fffffffffffffea8.lit,
                          in_stack_fffffffffffffea0,
                          (OutputType)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      GetDestinationForKey(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
      util::
      Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
      ::Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                *)CONCAT44(uVar5,uVar4),in_stack_fffffffffffffe60);
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant(in_stack_fffffffffffffe58);
    }
    else {
      ::_(in_stack_fffffffffffffea8);
      util::
      Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
      ::Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                *)CONCAT44(uVar5,uVar4),(Error *)in_stack_fffffffffffffe60);
      util::Error::~Error((Error *)in_stack_fffffffffffffe58);
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pszFile;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> LegacyScriptPubKeyMan::GetNewDestination(const OutputType type)
{
    if (LEGACY_OUTPUT_TYPES.count(type) == 0) {
        return util::Error{_("Error: Legacy wallets only support the \"legacy\", \"p2sh-segwit\", and \"bech32\" address types")};
    }
    assert(type != OutputType::BECH32M);

    // Fill-up keypool if needed
    TopUp();

    LOCK(cs_KeyStore);

    // Generate a new key that is added to wallet
    CPubKey new_key;
    if (!GetKeyFromPool(new_key, type)) {
        return util::Error{_("Error: Keypool ran out, please call keypoolrefill first")};
    }
    LearnRelatedScripts(new_key, type);
    return GetDestinationForKey(new_key, type);
}